

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::setTargetResolutionMode
          (InverseKinematics *this,string *frameName,InverseKinematicsTreatTargetAsConstraint mode)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::setTargetResolutionMode(const std::string& frameName, InverseKinematicsTreatTargetAsConstraint mode)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        internal::kinematics::TransformMap::iterator transConstr = IK_PIMPL(m_pimpl)->getTargetRefIfItExists(frameName);

        if( transConstr == IK_PIMPL(m_pimpl)->m_targets.end() )
        {
            std::stringstream ss;
            ss << "No target for frame " << frameName << " was added to the InverseKinematics problem.";
            reportError("InverseKinematics","setTargetResolutionMode",ss.str().c_str());
            return false;
        }

        IK_PIMPL(m_pimpl)->setTargetResolutionMode(transConstr, mode);
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }